

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

void __thiscall cmMakefile::PushFunctionScope(cmMakefile *this,string *fileName,PolicyMap *pm)

{
  cmStateSnapshot *originSnapshot;
  bool bVar1;
  cmStateSnapshot local_38;
  
  originSnapshot = &this->StateSnapshot;
  cmState::CreateFunctionCallSnapshot
            (&local_38,
             (this->GlobalGenerator->CMakeInstance->State)._M_t.
             super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,originSnapshot,fileName);
  (this->StateSnapshot).Position.Position = local_38.Position.Position;
  (this->StateSnapshot).State = (cmState *)CONCAT44(local_38.State._4_4_,local_38.State._0_4_);
  (this->StateSnapshot).Position.Tree = local_38.Position.Tree;
  bVar1 = cmStateSnapshot::IsValid(originSnapshot);
  if (bVar1) {
    local_38.State._0_4_ = 0;
    std::deque<int,_std::allocator<int>_>::emplace_back<int>
              (&(this->LoopBlockCounter).c,(int *)&local_38);
    cmFileLockPool::PushFunctionScope(&this->GlobalGenerator->FileLockPool);
    PushFunctionBlockerBarrier(this);
    cmStateSnapshot::PushPolicy(originSnapshot,pm,true);
    return;
  }
  __assert_fail("this->StateSnapshot.IsValid()",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/cmMakefile.cxx"
                ,0x58b,
                "void cmMakefile::PushFunctionScope(const std::string &, const cmPolicies::PolicyMap &)"
               );
}

Assistant:

void cmMakefile::PushFunctionScope(std::string const& fileName,
                                   const cmPolicies::PolicyMap& pm)
{
  this->StateSnapshot = this->GetState()->CreateFunctionCallSnapshot(
    this->StateSnapshot, fileName);
  assert(this->StateSnapshot.IsValid());

  this->PushLoopBlockBarrier();

#if defined(CMAKE_BUILD_WITH_CMAKE)
  this->GetGlobalGenerator()->GetFileLockPool().PushFunctionScope();
#endif

  this->PushFunctionBlockerBarrier();

  this->PushPolicy(true, pm);
}